

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QJsonValue * __thiscall QVariant::toJsonValue(QVariant *this)

{
  QJsonValue *in_RDI;
  QVariant *in_stack_00000028;
  
  qvariant_cast<QJsonValue>(in_stack_00000028);
  return in_RDI;
}

Assistant:

QJsonValue QVariant::toJsonValue() const
{
    return qvariant_cast<QJsonValue>(*this);
}